

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.h
# Opt level: O2

void __thiscall
chrono::fea::ChLoadXYZROTnodeXYZROTnodeBushingPlastic::~ChLoadXYZROTnodeXYZROTnodeBushingPlastic
          (ChLoadXYZROTnodeXYZROTnodeBushingPlastic *this)

{
  ChLoadCustomMultiple::~ChLoadCustomMultiple((ChLoadCustomMultiple *)this);
  ::operator_delete(this,0x3f8);
  return;
}

Assistant:

class ChApi ChLoadXYZROTnodeXYZROTnodeBushingPlastic : public ChLoadXYZROTnodeXYZROTnodeBushingSpherical {
  public:
    ChLoadXYZROTnodeXYZROTnodeBushingPlastic(
        std::shared_ptr<ChNodeFEAxyzrot> mnodeA,  ///< node A
        std::shared_ptr<ChNodeFEAxyzrot> mnodeB,  ///< node B
        const ChFrame<>&
            abs_application,  ///< create the bushing here, in abs. coordinates. Will define loc_application_A and B
        const ChVector<>& mstiffness,  ///< stiffness, along the x y z axes of the abs_application
        const ChVector<>& mdamping,    ///< damping, along the x y z axes of the abs_application
        const ChVector<>& myield       ///< plastic yield, along the x y z axes of the abs_application
    );

    /// Set plastic yield, forces beyond this limit will be capped.
    /// Expressed along the x y z axes of loc_application_B.
    void SetYeld(const ChVector<> myeld) { yield = myeld; }
    ChVector<> GetYeld() const { return yield; }

    /// Get the current accumulated plastic deformation.
    /// This could become nonzero if forces went beyond the plastic yield.
    ChVector<> GetPlasticDeformation() const { return plastic_def; }

  protected:
    ChVector<> yield;
    ChVector<> plastic_def;

    /// Compute the wrench (force & torque) between the two nodes, expressed in local frame of loc_application_B,
    /// given rel_AB, i.e. the position and speed of loc_application_A respect to loc_application_B, expressed in frame
    /// of loc_application_B. Force is assumed applied to loc_application_B, and its opposite reaction to A.
    virtual void ComputeForceTorque(const ChFrameMoving<>& rel_AB,
                                    ChVector<>& loc_force,
                                    ChVector<>& loc_torque) override;
}